

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O0

Point2f pbrt::WrapEqualAreaSquare(Point2f uv)

{
  float fVar1;
  float *pfVar2;
  undefined1 in_ZMM0 [64];
  Tuple2<pbrt::Point2,_float> local_10 [2];
  
  local_10[0] = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(in_ZMM0._0_16_);
  pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_10,0);
  if (0.0 <= *pfVar2) {
    pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_10,0);
    if (1.0 < *pfVar2) {
      pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_10,0);
      fVar1 = *pfVar2;
      pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_10,0);
      *pfVar2 = 2.0 - fVar1;
      pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_10,1);
      fVar1 = *pfVar2;
      pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_10,1);
      *pfVar2 = 1.0 - fVar1;
    }
  }
  else {
    pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_10,0);
    fVar1 = *pfVar2;
    pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_10,0);
    *pfVar2 = -fVar1;
    pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_10,1);
    fVar1 = *pfVar2;
    pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_10,1);
    *pfVar2 = 1.0 - fVar1;
  }
  pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_10,1);
  if (0.0 <= *pfVar2) {
    pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_10,1);
    if (1.0 < *pfVar2) {
      pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_10,0);
      fVar1 = *pfVar2;
      pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_10,0);
      *pfVar2 = 1.0 - fVar1;
      pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_10,1);
      fVar1 = *pfVar2;
      pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_10,1);
      *pfVar2 = 2.0 - fVar1;
    }
  }
  else {
    pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_10,0);
    fVar1 = *pfVar2;
    pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_10,0);
    *pfVar2 = 1.0 - fVar1;
    pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_10,1);
    fVar1 = *pfVar2;
    pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_10,1);
    *pfVar2 = -fVar1;
  }
  return (Point2f)local_10[0];
}

Assistant:

Point2f WrapEqualAreaSquare(Point2f uv) {
    if (uv[0] < 0) {
        uv[0] = -uv[0];     // mirror across u = 0
        uv[1] = 1 - uv[1];  // mirror across v = 0.5
    } else if (uv[0] > 1) {
        uv[0] = 2 - uv[0];  // mirror across u = 1
        uv[1] = 1 - uv[1];  // mirror across v = 0.5
    }
    if (uv[1] < 0) {
        uv[0] = 1 - uv[0];  // mirror across u = 0.5
        uv[1] = -uv[1];     // mirror across v = 0;
    } else if (uv[1] > 1) {
        uv[0] = 1 - uv[0];  // mirror across u = 0.5
        uv[1] = 2 - uv[1];  // mirror across v = 1
    }
    return uv;
}